

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

int peek(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *str_1;
  char *str;
  int c;
  
  str._0_4_ = peekInternal('\0');
  str._4_4_ = (int)str;
  if (lexerState->macroArgScanDistance == 0) {
    lexerState->macroArgScanDistance = lexerState->macroArgScanDistance + 1;
    if (((int)str == 0x5c) && ((lexerState->disableMacroArgs & 1U) == 0)) {
      lexerState->macroArgScanDistance = lexerState->macroArgScanDistance + 1;
      iVar2 = peekInternal('\x01');
      bVar1 = isMacroChar((char)iVar2);
      if (bVar1) {
        shiftChar();
        shiftChar();
        pcVar3 = readMacroArg((char)iVar2);
        if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
          iVar2 = peek();
          return iVar2;
        }
        beginExpansion(pcVar3,iVar2 == 0x23,(char *)0x0);
        sVar4 = strlen(pcVar3);
        lexerState->macroArgScanDistance = sVar4 + lexerState->macroArgScanDistance;
        str._0_4_ = (int)*pcVar3;
      }
      else {
        str._0_4_ = 0x5c;
      }
    }
    else if (((int)str == 0x7b) && ((lexerState->disableInterpolation & 1U) == 0)) {
      shiftChar();
      pcVar3 = readInterpolation(0);
      if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
        beginExpansion(pcVar3,false,pcVar3);
      }
      iVar2 = peek();
      return iVar2;
    }
    str._4_4_ = (int)str;
  }
  return str._4_4_;
}

Assistant:

static int peek(void)
{
	int c = peekInternal(0);

	if (lexerState->macroArgScanDistance > 0)
		return c;

	lexerState->macroArgScanDistance++; // Do not consider again

	if (c == '\\' && !lexerState->disableMacroArgs) {
		// If character is a backslash, check for a macro arg
		lexerState->macroArgScanDistance++;
		c = peekInternal(1);
		if (isMacroChar(c)) {
			shiftChar();
			shiftChar();
			char const *str = readMacroArg(c);

			// If the macro arg is invalid or an empty string, it cannot be
			// expanded, so skip it and keep peeking.
			if (!str || !str[0])
				return peek();

			beginExpansion(str, c == '#', NULL);

			// Assuming macro args can't be recursive (I'll be damned if a way
			// is found...), then we mark the entire macro arg as scanned.
			lexerState->macroArgScanDistance += strlen(str);

			c = str[0];
		} else {
			c = '\\';
		}
	} else if (c == '{' && !lexerState->disableInterpolation) {
		// If character is an open brace, do symbol interpolation
		shiftChar();
		char const *str = readInterpolation(0);

		if (str && str[0])
			beginExpansion(str, false, str);
		return peek();
	}

	return c;
}